

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCnRunner.cpp
# Opt level: O0

int __thiscall xmrig::OclCnRunner::init(OclCnRunner *this,EVP_PKEY_CTX *ctx)

{
  cl_mem p_Var1;
  reference pp_Var2;
  size_t i;
  cl_mem in_stack_ffffffffffffffe0;
  OclCnRunner *flags;
  OclBaseRunner *in_stack_fffffffffffffff0;
  OclCnRunner *this_00;
  
  OclBaseRunner::init(&this->super_OclBaseRunner,ctx);
  p_Var1 = OclBaseRunner::createSubBuffer
                     (in_stack_fffffffffffffff0,(cl_mem_flags)this,(size_t)in_stack_ffffffffffffffe0
                     );
  this->m_scratchpads = p_Var1;
  p_Var1 = OclBaseRunner::createSubBuffer
                     (in_stack_fffffffffffffff0,(cl_mem_flags)this,(size_t)in_stack_ffffffffffffffe0
                     );
  this->m_states = p_Var1;
  flags = this;
  this_00 = (OclCnRunner *)0x0;
  while (this_00 < (OclCnRunner *)0x4) {
    in_stack_ffffffffffffffe0 =
         OclBaseRunner::createSubBuffer
                   (&this_00->super_OclBaseRunner,(cl_mem_flags)flags,
                    (size_t)in_stack_ffffffffffffffe0);
    pp_Var2 = std::vector<_cl_mem_*,_std::allocator<_cl_mem_*>_>::operator[]
                        (&flags->m_branches,(size_type)this_00);
    *pp_Var2 = in_stack_ffffffffffffffe0;
    this = (OclCnRunner *)
           ((long)&(this_00->super_OclBaseRunner).super_IOclRunner._vptr_IOclRunner + 1);
    this_00 = this;
  }
  return (int)this;
}

Assistant:

void xmrig::OclCnRunner::init()
{
    OclBaseRunner::init();

    m_scratchpads = createSubBuffer(CL_MEM_READ_WRITE, CnAlgo::CN_MEMORY * m_intensity);
    m_states      = createSubBuffer(CL_MEM_READ_WRITE, 200 * m_intensity);

    for (size_t i = 0; i < BRANCH_MAX; ++i) {
        m_branches[i] = createSubBuffer(CL_MEM_READ_WRITE, sizeof(cl_uint) * (m_intensity + 2));
    }
}